

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::split_inner_node(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                   *this,inner_node *inner,key_type *_newkey,node **_newinner,uint addslot)

{
  size_type *psVar1;
  ushort uVar2;
  unsigned_short uVar3;
  node *__s;
  size_t __n;
  uint uVar4;
  
  uVar2 = (inner->super_node).slotuse;
  uVar4 = (uint)(uVar2 >> 1);
  if (addslot <= uVar4) {
    uVar4 = uVar4 - (~uVar4 + (uint)uVar2 < uVar4);
  }
  uVar3 = (inner->super_node).level;
  __s = (node *)operator_new(0x110);
  memset(__s,0,0x110);
  __s->level = uVar3;
  __s->slotuse = 0;
  psVar1 = &(this->m_stats).innernodes;
  *psVar1 = *psVar1 + 1;
  uVar2 = (inner->super_node).slotuse;
  __s->slotuse = ~(ushort)uVar4 + uVar2;
  __n = (long)inner + (((ulong)uVar2 * 8 + 8) - (long)(inner->slotkey + (ulong)uVar4 + 1));
  if (__n != 0) {
    memcpy(__s + 2,inner->slotkey + (ulong)uVar4 + 1,__n);
  }
  if (uVar2 != uVar4) {
    memcpy(__s + 0x22,inner->childid + (ulong)uVar4 + 1,
           (long)inner + ((ulong)uVar2 * 8 - (long)(inner->childid + (ulong)uVar4 + 1)) + 0x90);
  }
  (inner->super_node).slotuse = (ushort)uVar4;
  *_newkey = inner->slotkey[uVar4];
  *_newinner = __s;
  return;
}

Assistant:

void split_inner_node(inner_node* inner, key_type* _newkey, node** _newinner, unsigned int addslot)
        {
            BTREE_ASSERT(inner->isfull());

            unsigned int mid = (inner->slotuse >> 1);

            BTREE_PRINT("btree::split_inner: mid " << mid << " addslot " << addslot);

            // if the split is uneven and the overflowing item will be put into the
            // larger node, then the smaller split node may underflow
            if (addslot <= mid && mid > inner->slotuse - (mid + 1))
                mid--;

            BTREE_PRINT("btree::split_inner: mid " << mid << " addslot " << addslot);

            BTREE_PRINT("btree::split_inner_node on " << inner << " into two nodes " << mid << " and " << inner->slotuse - (mid + 1) << " sized");

            inner_node *newinner = allocate_inner(inner->level);

            newinner->slotuse = inner->slotuse - (mid + 1);

            std::copy(inner->slotkey + mid+1, inner->slotkey + inner->slotuse,
                      newinner->slotkey);
            std::copy(inner->childid + mid+1, inner->childid + inner->slotuse+1,
                      newinner->childid);

            inner->slotuse = mid;

            *_newkey = inner->slotkey[mid];
            *_newinner = newinner;
        }